

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

void quantize_row_q3_K_ref(float *x,block_q3_K *y,int64_t k)

{
  char cVar1;
  block_q3_K *pbVar2;
  ggml_fp16_t gVar3;
  int j_1;
  ulong uVar4;
  int8_t *piVar5;
  ulong uVar6;
  float *pfVar7;
  int ii;
  uint8_t *puVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  byte bVar13;
  uint uVar14;
  int iVar15;
  int i_2;
  uint8_t *puVar16;
  uint8_t *puVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float scales [16];
  int8_t L [256];
  
  uVar4 = k / 0x100 & 0xffffffff;
  if ((int)(k / 0x100) < 1) {
    uVar4 = 0;
  }
  puVar16 = y->qs + 0x38;
  puVar17 = y->qs;
  uVar10 = 0;
  do {
    if (uVar10 == uVar4) {
      return;
    }
    piVar5 = L;
    fVar18 = 0.0;
    pfVar7 = x;
    fVar19 = 0.0;
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
      fVar20 = 0.0;
      fVar21 = 0.0;
      for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
        fVar23 = ABS(pfVar7[lVar12]);
        fVar22 = fVar23;
        if (fVar23 <= fVar21) {
          fVar22 = fVar21;
        }
        fVar20 = (float)(~-(uint)(fVar21 < fVar23) & (uint)fVar20 |
                        (uint)pfVar7[lVar12] & -(uint)(fVar21 < fVar23));
        fVar21 = fVar22;
      }
      if (1e-15 <= fVar21) {
        fVar21 = 0.0;
        fVar22 = 0.0;
        for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
          fVar23 = pfVar7[lVar12];
          uVar14 = (uint)(12582912.0 - (4.0 / fVar20) * fVar23) & 0x7fffff;
          if (0x400002 < uVar14) {
            uVar14 = 0x400003;
          }
          if (uVar14 < 0x3ffffd) {
            uVar14 = 0x3ffffc;
          }
          piVar5[lVar12] = (int8_t)uVar14;
          fVar24 = (float)(int)(uVar14 - 0x400000);
          fVar21 = fVar21 + fVar24 * fVar23 * fVar23 * fVar24;
          fVar22 = fVar22 + fVar24 * fVar23 * fVar23 * fVar23;
        }
        iVar11 = 0;
        do {
          if (iVar11 == 5) break;
          iVar15 = 0;
          for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
            fVar20 = pfVar7[lVar12];
            fVar24 = fVar20 * fVar20;
            fVar25 = (float)(int)piVar5[lVar12];
            fVar23 = fVar22 - fVar20 * fVar24 * fVar25;
            if (0.0 < fVar23) {
              fVar25 = -fVar24 * fVar25 * fVar25 + fVar21;
              uVar14 = (uint)((fVar20 * fVar25) / fVar23 + 12582912.0) & 0x7fffff;
              if (0x400002 < uVar14) {
                uVar14 = 0x400003;
              }
              if (uVar14 < 0x3ffffd) {
                uVar14 = 0x3ffffc;
              }
              if (uVar14 - 0x400000 != (int)piVar5[lVar12]) {
                fVar26 = (float)(int)(uVar14 - 0x400000);
                fVar25 = fVar25 + fVar26 * fVar24 * fVar26;
                fVar23 = fVar23 + fVar26 * fVar24 * fVar20;
                if ((0.0 < fVar25) && (fVar22 * fVar22 * fVar25 < fVar23 * fVar23 * fVar21)) {
                  piVar5[lVar12] = (int8_t)uVar14;
                  iVar15 = iVar15 + 1;
                  fVar21 = fVar25;
                  fVar22 = fVar23;
                }
              }
            }
          }
          iVar11 = iVar11 + 1;
        } while (iVar15 != 0);
        for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
          piVar5[lVar12] = piVar5[lVar12] + '\x04';
        }
        fVar22 = fVar22 / fVar21;
      }
      else {
        for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
          piVar5[lVar12] = '\0';
        }
        fVar22 = 0.0;
      }
      scales[lVar9] = fVar22;
      fVar20 = ABS(fVar22);
      fVar21 = fVar20;
      if (fVar20 <= fVar19) {
        fVar21 = fVar19;
      }
      fVar18 = (float)(~-(uint)(fVar19 < fVar20) & (uint)fVar18 |
                      (uint)fVar22 & -(uint)(fVar19 < fVar20));
      pfVar7 = pfVar7 + 0x10;
      piVar5 = piVar5 + 0x10;
      fVar19 = fVar21;
    }
    pbVar2 = y + uVar10;
    pbVar2->scales[8] = '\0';
    pbVar2->scales[9] = '\0';
    pbVar2->scales[10] = '\0';
    pbVar2->scales[0xb] = '\0';
    pbVar2 = y + uVar10;
    pbVar2->scales[0] = '\0';
    pbVar2->scales[1] = '\0';
    pbVar2->scales[2] = '\0';
    pbVar2->scales[3] = '\0';
    pbVar2->scales[4] = '\0';
    pbVar2->scales[5] = '\0';
    pbVar2->scales[6] = '\0';
    pbVar2->scales[7] = '\0';
    pbVar2 = y + uVar10;
    if ((fVar18 != 0.0) || (NAN(fVar18))) {
      for (uVar6 = 0; uVar6 != 0x10; uVar6 = uVar6 + 1) {
        iVar11 = (int)SUB41(scales[uVar6] * (-32.0 / fVar18) + 12582912.0,0);
        if (0x1e < iVar11) {
          iVar11 = 0x1f;
        }
        if (iVar11 < -0x1f) {
          iVar11 = -0x20;
        }
        if (uVar6 < 8) {
          puVar16[uVar6 + 8] = (byte)iVar11 & 0xf;
        }
        else {
          puVar16[uVar6] = puVar16[uVar6] | (byte)iVar11 << 4;
        }
        y[uVar10].scales[(ulong)((uint)uVar6 & 3) + 8] =
             y[uVar10].scales[(ulong)((uint)uVar6 & 3) + 8] |
             (byte)((iVar11 * 0x100000 + 0x2000000U >> 0x18) <<
                   ((byte)((uVar6 & 0xffffffff) >> 1) & 6));
      }
      gVar3 = ggml_compute_fp32_to_fp16(1.0 / (-32.0 / fVar18));
      pbVar2->d = gVar3;
      uVar6 = (ulong)gVar3;
    }
    else {
      pbVar2->d = 0;
      uVar6 = 0;
    }
    fVar19 = ggml_table_f32_f16[uVar6];
    piVar5 = L;
    pfVar7 = x;
    for (uVar6 = 0; uVar6 != 0x10; uVar6 = uVar6 + 1) {
      if (uVar6 < 8) {
        bVar13 = y[uVar10].scales[uVar6] & 0xf;
      }
      else {
        bVar13 = y[uVar10].qs[uVar6 + 0x38] >> 4;
      }
      fVar18 = (float)(int)(char)(((y[uVar10].scales[(ulong)((uint)uVar6 & 3) + 8] >>
                                    ((byte)((uVar6 & 0xffffffff) >> 1) & 6) & 3) << 4 | bVar13) -
                                 0x20) * fVar19;
      if ((fVar18 != 0.0) || (NAN(fVar18))) {
        for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
          uVar14 = (uint)(pfVar7[lVar9] / fVar18 + 12582912.0) & 0x7fffff;
          if (0x400002 < uVar14) {
            uVar14 = 0x400003;
          }
          if (uVar14 < 0x3ffffd) {
            uVar14 = 0x3ffffc;
          }
          piVar5[lVar9] = (char)uVar14 + '\x04';
        }
      }
      piVar5 = piVar5 + 0x10;
      pfVar7 = pfVar7 + 0x10;
    }
    pbVar2->hmask[0x10] = '\0';
    pbVar2->hmask[0x11] = '\0';
    pbVar2->hmask[0x12] = '\0';
    pbVar2->hmask[0x13] = '\0';
    pbVar2->hmask[0x14] = '\0';
    pbVar2->hmask[0x15] = '\0';
    pbVar2->hmask[0x16] = '\0';
    pbVar2->hmask[0x17] = '\0';
    pbVar2->hmask[0x18] = '\0';
    pbVar2->hmask[0x19] = '\0';
    pbVar2->hmask[0x1a] = '\0';
    pbVar2->hmask[0x1b] = '\0';
    pbVar2->hmask[0x1c] = '\0';
    pbVar2->hmask[0x1d] = '\0';
    pbVar2->hmask[0x1e] = '\0';
    pbVar2->hmask[0x1f] = '\0';
    pbVar2->hmask[0] = '\0';
    pbVar2->hmask[1] = '\0';
    pbVar2->hmask[2] = '\0';
    pbVar2->hmask[3] = '\0';
    pbVar2->hmask[4] = '\0';
    pbVar2->hmask[5] = '\0';
    pbVar2->hmask[6] = '\0';
    pbVar2->hmask[7] = '\0';
    pbVar2->hmask[8] = '\0';
    pbVar2->hmask[9] = '\0';
    pbVar2->hmask[10] = '\0';
    pbVar2->hmask[0xb] = '\0';
    pbVar2->hmask[0xc] = '\0';
    pbVar2->hmask[0xd] = '\0';
    pbVar2->hmask[0xe] = '\0';
    pbVar2->hmask[0xf] = '\0';
    bVar13 = 1;
    uVar6 = 0;
    for (lVar9 = 0; lVar9 != 0x100; lVar9 = lVar9 + 1) {
      cVar1 = L[lVar9];
      if ('\x03' < cVar1) {
        pbVar2->hmask[(int)uVar6] = pbVar2->hmask[(int)uVar6] | bVar13;
        L[lVar9] = cVar1 + -4;
      }
      uVar14 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar14;
      if (uVar14 == 0x20) {
        uVar6 = 0;
      }
      bVar13 = bVar13 << (uVar14 == 0x20);
    }
    piVar5 = L + 0x60;
    puVar8 = puVar17;
    for (uVar6 = 0; lVar9 = -0x20, uVar6 < 0x100; uVar6 = uVar6 + 0x80) {
      for (; lVar9 != 0; lVar9 = lVar9 + 1) {
        puVar8[lVar9 + 0x20] =
             piVar5[lVar9 + 0x20] << 6 | piVar5[lVar9] << 4 |
             piVar5[lVar9 + -0x20] << 2 | piVar5[lVar9 + -0x40];
      }
      puVar8 = puVar8 + 0x20;
      piVar5 = piVar5 + 0x80;
    }
    x = x + 0x100;
    uVar10 = uVar10 + 1;
    puVar16 = puVar16 + 0x6e;
    puVar17 = puVar17 + 0x6e;
  } while( true );
}

Assistant:

void quantize_row_q3_K_ref(const float * GGML_RESTRICT x, block_q3_K * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int nb = k / QK_K;

    int8_t L[QK_K];
    float scales[QK_K / 16];

    for (int i = 0; i < nb; i++) {

        float max_scale = 0;
        float amax = 0;
        for (int j = 0; j < QK_K/16; ++j) {
            scales[j] = make_q3_quants(16, 4, x + 16*j, L + 16*j, true);
            float scale = fabsf(scales[j]);
            if (scale > amax) {
                amax = scale; max_scale = scales[j];
            }
        }

        memset(y[i].scales, 0, 12);
        if (max_scale) {
            float iscale = -32.f/max_scale;
            for (int j = 0; j < QK_K/16; ++j) {
                int8_t l = nearest_int(iscale*scales[j]);
                l = MAX(-32, MIN(31, l)) + 32;
                if (j < 8) {
                    y[i].scales[j] = l & 0xF;
                } else {
                    y[i].scales[j-8] |= ((l & 0xF) << 4);
                }
                l >>= 4;
                y[i].scales[j%4 + 8] |= (l << (2*(j/4)));
            }
            y[i].d = GGML_FP32_TO_FP16(1/iscale);
        } else {
            y[i].d = GGML_FP32_TO_FP16(0.f);
        }

        int8_t sc;
        for (int j = 0; j < QK_K/16; ++j) {
            sc = j < 8 ? y[i].scales[j] & 0xF : y[i].scales[j-8] >> 4;
            sc = (sc | (((y[i].scales[8 + j%4] >> (2*(j/4))) & 3) << 4)) - 32;
            float d = GGML_FP16_TO_FP32(y[i].d) * sc;
            if (!d) {
                continue;
            }
            for (int ii = 0; ii < 16; ++ii) {
                int l = nearest_int(x[16*j + ii]/d);
                l = MAX(-4, MIN(3, l));
                L[16*j + ii] = l + 4;
            }
        }

        memset(y[i].hmask, 0, QK_K/8);
        // We put the high-bit for the 1st 8 quants into bit 0, the next 8 into bit 1, etc.
        int m = 0;
        uint8_t hm = 1;
        for (int j = 0; j < QK_K; ++j) {
            if (L[j] > 3) {
                y[i].hmask[m] |= hm;
                L[j] -= 4;
            }
            if (++m == QK_K/8) {
                m = 0; hm <<= 1;
            }
        }
        for (int j = 0; j < QK_K; j += 128) {
            for (int l = 0; l < 32; ++l) {
                y[i].qs[j/4 + l] = L[j + l] | (L[j + l + 32] << 2) | (L[j + l + 64] << 4) | (L[j + l + 96] << 6);
            }
        }

        x += QK_K;
    }
}